

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_phone_list.c
# Opt level: O3

acmod_id_t * mk_boundary_phone(char *word,uint32 n_begin,lexicon_t *lex)

{
  uint32 uVar1;
  acmod_id_t aVar2;
  lex_entry_t *plVar3;
  acmod_id_t *paVar4;
  
  plVar3 = lexicon_lookup(lex,word);
  if (plVar3 == (lex_entry_t *)0x0) {
    paVar4 = (acmod_id_t *)0x0;
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
            ,0x117,"Unable to lookup word \'%s\' in the dictionary\n",word);
  }
  else {
    uVar1 = plVar3->phone_cnt;
    paVar4 = (acmod_id_t *)
             __ckd_calloc__(1,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_phone_list.c"
                            ,0x11d);
    if (uVar1 != 0) {
      if (n_begin == 1) {
        aVar2 = *plVar3->ci_acmod_id;
      }
      else {
        aVar2 = plVar3->ci_acmod_id[uVar1 - 1];
      }
      *paVar4 = aVar2;
    }
  }
  return paVar4;
}

Assistant:

acmod_id_t *
mk_boundary_phone(char *word,
		  uint32 n_begin,
		  lexicon_t *lex)
{
  uint32 n_p;
  lex_entry_t *e;
  acmod_id_t *p;
  
  e = lexicon_lookup(lex, word);
  if (e == NULL) {
    E_WARN("Unable to lookup word '%s' in the dictionary\n", word);
    
    return NULL;
  }
  n_p = e->phone_cnt;
  
  p = ckd_calloc(1, sizeof(acmod_id_t));
  
  if (n_p != 0) {
    if (n_begin == 1)
      p[0] = e->ci_acmod_id[0];
    else
      p[0] = e->ci_acmod_id[n_p-1];
  }
  
  return p;
}